

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonValue *other)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  long in_FS_OFFSET;
  QCborValue local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->value).n = (other->value).n;
  pQVar2 = (other->value).container;
  (other->value).container = (QCborContainerPrivate *)0x0;
  (this->value).container = pQVar2;
  TVar1 = (other->value).t;
  (other->value).t = Undefined;
  (this->value).t = TVar1;
  local_28.n = 0;
  local_28.container = (QCborContainerPrivate *)0x0;
  local_28.t = Null;
  QCborValue::operator=((QCborValue *)other,&local_28);
  QCborValue::~QCborValue((QCborValue *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(QJsonValue &&other) noexcept
    : value(std::move(other.value))
{
    other.value = QCborValue(nullptr);
}